

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall Debugger::ExecuteWithSkipHook(Debugger *this,Executor *exec)

{
  bool bVar1;
  bool skip;
  Executor *exec_local;
  Debugger *this_local;
  
  bVar1 = this->skipHook;
  this->skipHook = true;
  std::function<void_(lua_State_*)>::operator()(exec,this->currentL);
  this->skipHook = (bool)(bVar1 & 1);
  return;
}

Assistant:

void Debugger::ExecuteWithSkipHook(const Executor &exec) {
	const bool skip = skipHook;
	skipHook = true;
	exec(currentL);
	skipHook = skip;
}